

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

void __thiscall
ON_ReadChunkHelper::ON_ReadChunkHelper
          (ON_ReadChunkHelper *this,ON_BinaryArchive *binary_archive,bool *bReadSuccess)

{
  bool bVar1;
  bool *bReadSuccess_local;
  ON_BinaryArchive *binary_archive_local;
  ON_ReadChunkHelper *this_local;
  
  this->m_binary_archive = binary_archive;
  this->m_chunk_tcode = 0;
  this->m_bSupressPartiallyReadChunkWarning = false;
  this->m_chunk_value = 0;
  this->m_bReadSuccess = bReadSuccess;
  this->m_bCallEndRead3dmChunk = false;
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk
                    (this->m_binary_archive,&this->m_chunk_tcode,&this->m_chunk_value);
  this->m_bCallEndRead3dmChunk = bVar1;
  if (((this->m_bCallEndRead3dmChunk & 1U) == 0) || (this->m_chunk_tcode == 0)) {
    *this->m_bReadSuccess = false;
  }
  return;
}

Assistant:

ON_ReadChunkHelper::ON_ReadChunkHelper(
  ON_BinaryArchive& binary_archive,
  bool &bReadSuccess
  )
: m_binary_archive(binary_archive)
, m_bReadSuccess(bReadSuccess)
{
  m_bCallEndRead3dmChunk = m_binary_archive.BeginRead3dmBigChunk(&m_chunk_tcode,&m_chunk_value);
  if ( false == m_bCallEndRead3dmChunk || 0 ==  m_chunk_tcode )
  {
    // RH-22447 - valid chunk typecodes are never zero
    m_bReadSuccess = false; 
  }  
}